

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O1

void __thiscall BarrierTest_Ctor_Test::TestBody(BarrierTest_Ctor_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  TrueWithString gtest_msg;
  condition_variable local_70 [48];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::condition_variable::condition_variable(local_70);
    local_30 = 0;
    uStack_28 = 0;
    local_40 = 0;
    uStack_38 = 0;
    local_20 = 0;
    std::condition_variable::~condition_variable(local_70);
  }
  return;
}

Assistant:

TEST(BarrierTest, Ctor)
{
  EXPECT_NO_THROW(yamc::barrier<>{1});
}